

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BSA_SpikeDecodingSynapse.cpp
# Opt level: O1

void __thiscall BSA_SpikeDecodingSynapse::update(BSA_SpikeDecodingSynapse *this)

{
  BSA_SpikeDecodingSynapse_param *pBVar1;
  pointer pdVar2;
  pointer pdVar3;
  _Elt_pointer pdVar4;
  Population *pPVar5;
  double in_RAX;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  double *pdVar11;
  long lVar12;
  double local_38;
  
  if (0 < this->inputSize) {
    lVar12 = 0;
    local_38 = in_RAX;
    do {
      std::deque<double,_std::allocator<double>_>::pop_front
                ((this->input).
                 super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar12);
      local_38 = 0.0;
      std::deque<double,_std::allocator<double>_>::emplace_back<double>
                ((this->input).
                 super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar12,&local_38);
      if (((((this->super_Synapse).from_population)->output).
           super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar12]->type == Spike) && (pBVar1 = this->param, 0.0 < pBVar1->filter_length))
      {
        pdVar2 = (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar3 = (this->input).
                 super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar4 = pdVar3[lVar12].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                 super__Deque_impl_data._M_start._M_cur;
        lVar8 = (long)pdVar4 -
                (long)pdVar3[lVar12].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_first;
        lVar9 = lVar8 >> 3;
        lVar10 = 0;
        do {
          uVar6 = lVar9 + lVar10;
          if (uVar6 < 0x40) {
            pdVar11 = pdVar4 + lVar10;
          }
          else {
            uVar7 = uVar6 >> 6 | 0xfc00000000000000;
            if (0 < (long)uVar6) {
              uVar7 = uVar6 >> 6;
            }
            pdVar11 = (double *)
                      ((long)pdVar3[lVar12].super__Deque_base<double,_std::allocator<double>_>.
                             _M_impl.super__Deque_impl_data._M_start._M_node[uVar7] +
                      lVar8 + uVar7 * -0x200);
          }
          *pdVar11 = pdVar2[lVar10] + *pdVar11;
          lVar10 = lVar10 + 1;
          lVar8 = lVar8 + 8;
        } while ((double)(int)lVar10 < pBVar1->filter_length);
      }
      pdVar3 = (this->input).
               super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar11 = pdVar3[lVar12].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur;
      uVar6 = (long)pdVar11 -
              (long)pdVar3[lVar12].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_start._M_first >> 3;
      if (0x3f < uVar6) {
        uVar7 = uVar6 >> 6 | 0xfc00000000000000;
        if (0 < (long)uVar6) {
          uVar7 = uVar6 >> 6;
        }
        pdVar11 = pdVar3[lVar12].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                  super__Deque_impl_data._M_start._M_node[uVar7] + uVar6 + uVar7 * -0x40;
      }
      (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
      super__Vector_impl_data._M_start[lVar12][1]._vptr_Event =
           (_func_int **)(*pdVar11 * this->param->threshold);
      pPVar5 = (this->super_Synapse).to_population;
      (*pPVar5->_vptr_Population[5])(pPVar5,0);
      pdVar3 = (this->input).
               super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar11 = pdVar3[lVar12].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur;
      uVar6 = (long)pdVar11 -
              (long)pdVar3[lVar12].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_start._M_first >> 3;
      if (0x3f < uVar6) {
        uVar7 = uVar6 >> 6 | 0xfc00000000000000;
        if (0 < (long)uVar6) {
          uVar7 = uVar6 >> 6;
        }
        pdVar11 = pdVar3[lVar12].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                  super__Deque_impl_data._M_start._M_node[uVar7] + uVar6 + uVar7 * -0x40;
      }
      Logging::logValue(this->logger,(long)this,(int)lVar12,3,*pdVar11 * this->param->threshold);
      lVar12 = lVar12 + 1;
    } while (lVar12 < this->inputSize);
  }
  return;
}

Assistant:

void BSA_SpikeDecodingSynapse::update() {
    for(int i = 0; i < inputSize; i++) {
        input[i].pop_front();
        input[i].push_back(0);
        if(from_population->output[i]->type == EventType::Spike) {
            for(int j = 0; j < param->filter_length; j++) {
                input[i][j] += filter[j];
            }
        }
        static_cast<ValueEvent*>(output[i])->setValue(input[i][0]*param->threshold);
        to_population->setInput(0, output[i]);
        logger->logValue((long)this, i, EventType::Value, input[i][0]*param->threshold);
    }
}